

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_2ddrawer.cpp
# Opt level: O3

void __thiscall
F2DDrawer::AddDim(F2DDrawer *this,PalEntry color,float damount,int x1,int y1,int w,int h)

{
  uchar *puVar1;
  uint uVar2;
  FSimpleVertex *pFVar3;
  uchar *puVar4;
  uint uVar5;
  
  TArray<FSimpleVertex,_FSimpleVertex>::Grow(&this->mVertices,4);
  uVar2 = (this->mVertices).Count;
  (this->mVertices).Count = uVar2 + 4;
  pFVar3 = (this->mVertices).Array;
  uVar5 = (uint)color.field_0 >> 0x10 & 0xff |
          (uint)color.field_0 & 0xff00 |
          ((uint)color.field_0 & 0xff) << 0x10 | (int)(damount * 255.0) << 0x18;
  pFVar3[(int)uVar2].x = (float)x1;
  pFVar3[(int)uVar2].z = (float)y1;
  pFVar3[(int)uVar2].y = 0.0;
  pFVar3[(int)uVar2].u = 0.0;
  pFVar3[(int)uVar2].v = 0.0;
  pFVar3[(int)uVar2].color.field_0.d = uVar5;
  pFVar3[(long)(int)uVar2 + 1].x = (float)x1;
  pFVar3[(long)(int)uVar2 + 1].z = (float)(h + y1);
  pFVar3[(long)(int)uVar2 + 1].y = 0.0;
  pFVar3[(long)(int)uVar2 + 1].u = 0.0;
  pFVar3[(long)(int)uVar2 + 1].v = 0.0;
  pFVar3[(long)(int)uVar2 + 1].color.field_0.d = uVar5;
  pFVar3[(long)(int)uVar2 + 2].x = (float)(w + x1);
  pFVar3[(long)(int)uVar2 + 2].z = (float)(h + y1);
  pFVar3[(long)(int)uVar2 + 2].y = 0.0;
  pFVar3[(long)(int)uVar2 + 2].u = 0.0;
  pFVar3[(long)(int)uVar2 + 2].v = 0.0;
  pFVar3[(long)(int)uVar2 + 2].color.field_0.d = uVar5;
  pFVar3[(long)(int)uVar2 + 3].x = (float)(w + x1);
  pFVar3[(long)(int)uVar2 + 3].z = (float)y1;
  pFVar3[(long)(int)uVar2 + 3].y = 0.0;
  pFVar3[(long)(int)uVar2 + 3].u = 0.0;
  pFVar3[(long)(int)uVar2 + 3].v = 0.0;
  pFVar3[(long)(int)uVar2 + 3].color.field_0.d = uVar5;
  TArray<unsigned_char,_unsigned_char>::Grow(&this->mData,0x10);
  uVar5 = (this->mData).Count;
  (this->mData).Count = uVar5 + 0x10;
  puVar4 = (this->mData).Array;
  puVar1 = puVar4 + (int)uVar5;
  puVar1[0] = '\x01';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\x10';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  *(uint *)(puVar4 + (long)(int)uVar5 + 8) = uVar2;
  puVar4 = puVar4 + (long)(int)uVar5 + 0xc;
  puVar4[0] = '\x04';
  puVar4[1] = '\0';
  puVar4[2] = '\0';
  puVar4[3] = '\0';
  this->mLastLineCmd = -1;
  return;
}

Assistant:

void F2DDrawer::AddDim(PalEntry color, float damount, int x1, int y1, int w, int h)
{
	color.a = uint8_t(damount * 255);
	std::swap(color.r, color.b);

	DataGeneric dg;

	dg.mType = DrawTypeDim;
	dg.mLen = (sizeof(dg) + 7) & ~7;
	dg.mVertCount = 4;
	dg.mVertIndex = (int)mVertices.Reserve(4);
	FSimpleVertex *ptr = &mVertices[dg.mVertIndex];
	ptr->Set(x1, y1, 0, 0, 0, color); ptr++;
	ptr->Set(x1, y1 + h, 0, 0, 0, color); ptr++;
	ptr->Set(x1 + w, y1 + h, 0, 0, 0, color); ptr++;
	ptr->Set(x1 + w, y1, 0, 0, 0, color); ptr++;
	AddData(&dg);
}